

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

StatusCode __thiscall HttpConn::parseRequest(HttpConn *this)

{
  bool bVar1;
  int end_idx;
  StatusCode SVar2;
  int idx;
  bool hasMore;
  StatusCode code;
  HttpConn *this_local;
  
  bVar1 = true;
  do {
    if (!bVar1) {
      return Wait;
    }
    switch(this->parseState_) {
    case CheckRequestLine:
      end_idx = findCRLF(this,this->checked_idx_);
      if (end_idx == -1) {
        bVar1 = false;
      }
      else {
        SVar2 = parseRequesetLine(this,end_idx);
        if (SVar2 == OK) {
          this->parseState_ = CheckHeaders;
        }
        else if (SVar2 == BadRequest) {
          std::__cxx11::string::operator=((string *)&this->body_,"Error Request Line!");
          return BadRequest;
        }
      }
      break;
    case CheckHeaders:
      SVar2 = parseHeader(this);
      if (SVar2 == OK) {
        this->parseState_ = CheckBody;
      }
      else {
        if (SVar2 == BadRequest) {
          std::__cxx11::string::operator=((string *)&this->body_,"Error Header!");
          return BadRequest;
        }
        bVar1 = false;
      }
      break;
    case CheckBody:
      SVar2 = parseBody(this);
      if (SVar2 == OK) {
        this->parseState_ = Finished;
        SVar2 = processRequest(this);
        return SVar2;
      }
      if (SVar2 != Wait) {
        bVar1 = false;
      }
      break;
    case Finished:
      bVar1 = false;
    }
  } while( true );
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequest() {
    StatusCode code;
    bool hasMore = true;
    while (hasMore) {
    
        switch (parseState_) {
        case CheckRequestLine: 
        {
            int idx = findCRLF(checked_idx_);
            if (idx != -1) {
                code = parseRequesetLine(idx);
                if (code == OK){ 
                    parseState_ = CheckHeaders; 
                }
                else if (code == BadRequest) { 
                    body_ = "Error Request Line!";
                    return BadRequest; 
                }
            } else {
                hasMore = false;
            }
            break;
        }
        case CheckHeaders:
        {
            code = parseHeader();
            if (code == OK) {
                parseState_ = CheckBody;
            } else if (code == BadRequest) {
                body_  = "Error Header!";
                return BadRequest;
            }
            else hasMore = false;
            break;
        }
        case CheckBody:
        {
            code = parseBody();
            if (code == OK) {
                parseState_ = Finished;
                return processRequest();
            } 
            if (code != Wait)
                hasMore = false;
            break;
        }
        case Finished: hasMore = false; break;

    }

    }
    return Wait;
}